

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O1

void __thiscall Draw::ClearScreen(Draw *this)

{
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  
  printf("\x1bc");
  printf("\x1b[?25l",in_RSI,extraout_RDX,in_RAX);
  return;
}

Assistant:

void Draw::ClearScreen() {
#ifdef _WIN32
    /* 重设光标输出位置清屏可以减少闪烁，system("cls")为备用清屏命令，均为Windows平台相关*/
    COORD pos = {0, 0};
    SetConsoleCursorPosition(GetStdHandle(STD_OUTPUT_HANDLE), pos);
    CONSOLE_CURSOR_INFO info = {1, 0};
    SetConsoleCursorInfo(GetStdHandle(STD_OUTPUT_HANDLE), &info);
#else
    printf("\033c");     /* linux下的清屏命令 */
    printf("\033[?25l"); /* linux下的隐藏输入光标 */
#endif
}